

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O3

BeagleBenchmarkedResourceList *
beagleGetBenchmarkedResourceList
          (int tipCount,int compactBufferCount,int stateCount,int patternCount,int categoryCount,
          int *resourceList,int resourceCount,long preferenceFlags,long requirementFlags,
          int eigenModelCount,int partitionCount,int calculateDerivatives,long benchmarkFlags)

{
  BeagleResource *pBVar1;
  long *plVar2;
  undefined8 uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  _List_node_base *possibleResources;
  list<BeagleBenchmarkedResource,std::allocator<BeagleBenchmarkedResource>> *this;
  _List_node_base *p_Var7;
  BeagleBenchmarkedResourceList *pBVar8;
  BeagleBenchmarkedResource *pBVar9;
  long lVar10;
  list<BeagleBenchmarkedResource,std::allocator<BeagleBenchmarkedResource>> *plVar11;
  list<BeagleBenchmarkedResource,std::allocator<BeagleBenchmarkedResource>> *plVar12;
  undefined4 in_register_00000034;
  int rescaleFrequency;
  _Node *__tmp;
  _List_node_base *p_Var13;
  bool bVar14;
  int compactTipCount;
  int resourceNumber;
  int local_84;
  long benchedFlags;
  char *implName;
  undefined8 local_70;
  double itBenchmarkResult;
  double benchmarkResultCPU;
  _List_node_base *local_58;
  _List_node_base *p_Stack_50;
  _List_node_base *p_Stack_48;
  _List_node_base *p_Stack_40;
  
  local_70 = CONCAT44(in_register_00000034,compactBufferCount);
  local_84 = tipCount;
  if (rsrcList == (BeagleResourceList *)0x0) {
    beagleGetResourceList();
  }
  if (implFactory_abi_cxx11_ ==
      (list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_> *)0x0) {
    beagleGetFactoryList_abi_cxx11_();
  }
  possibleResources = (_List_node_base *)operator_new(0x18);
  possibleResources->_M_prev = possibleResources;
  possibleResources->_M_next = possibleResources;
  possibleResources[1]._M_next = (_List_node_base *)0x0;
  iVar5 = filterResources(resourceList,resourceCount,preferenceFlags,requirementFlags,
                          (PairedList *)possibleResources);
  if (iVar5 == 0) {
    this = (list<BeagleBenchmarkedResource,std::allocator<BeagleBenchmarkedResource>> *)
           operator_new(0x18);
    p_Var13 = possibleResources->_M_next;
    *(list<BeagleBenchmarkedResource,std::allocator<BeagleBenchmarkedResource>> **)(this + 8) = this
    ;
    *(list<BeagleBenchmarkedResource,std::allocator<BeagleBenchmarkedResource>> **)this = this;
    *(undefined8 *)(this + 0x10) = 0;
    if (p_Var13 != possibleResources) {
      do {
        iVar5 = *(int *)((long)&p_Var13[1]._M_next + 4);
        pBVar1 = rsrcList->list + iVar5;
        local_58 = (_List_node_base *)pBVar1->name;
        p_Stack_50 = (_List_node_base *)pBVar1->description;
        p_Stack_48 = (_List_node_base *)pBVar1->supportFlags;
        p_Stack_40 = (_List_node_base *)pBVar1->requiredFlags;
        p_Var7 = (_List_node_base *)operator_new(0x60);
        *(int *)&p_Var7[1]._M_next = iVar5;
        p_Var7[1]._M_prev = local_58;
        p_Var7[2]._M_next = p_Stack_50;
        p_Var7[2]._M_prev = p_Stack_48;
        p_Var7[3]._M_next = p_Stack_40;
        std::__detail::_List_node_base::_M_hook(p_Var7);
        *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
        p_Var13 = (((_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                   &p_Var13->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      } while (p_Var13 != possibleResources);
      p_Var13 = possibleResources->_M_next;
    }
    while (p_Var13 != possibleResources) {
      p_Var7 = p_Var13->_M_next;
      operator_delete(p_Var13);
      p_Var13 = p_Var7;
    }
    operator_delete(possibleResources);
    iVar5 = local_84;
    rescaleFrequency = 1;
    if ((benchmarkFlags & 2U) == 0) {
      rescaleFrequency = 0x1e;
    }
    compactTipCount = (int)local_70;
    iVar6 = beagle::benchmark::benchmarkResource
                      (0,stateCount,local_84,patternCount,(benchmarkFlags & 1U) == 0,categoryCount,
                       0xf,compactTipCount,rescaleFrequency,calculateDerivatives != 0,
                       calculateDerivatives != 0,eigenModelCount,partitionCount,
                       requirementFlags | preferenceFlags,0,&resourceNumber,&implName,&benchedFlags,
                       &benchmarkResultCPU,false);
    pBVar8 = (BeagleBenchmarkedResourceList *)0x0;
    if (iVar6 == 0) {
      for (plVar12 = *(list<BeagleBenchmarkedResource,std::allocator<BeagleBenchmarkedResource>> **)
                      this; plVar12 != this;
          plVar12 = *(list<BeagleBenchmarkedResource,std::allocator<BeagleBenchmarkedResource>> **)
                     plVar12) {
        iVar6 = beagle::benchmark::benchmarkResource
                          (*(int *)(plVar12 + 0x10),stateCount,iVar5,patternCount,
                           (benchmarkFlags & 1U) == 0,categoryCount,0xf,compactTipCount,
                           rescaleFrequency,calculateDerivatives != 0,calculateDerivatives != 0,
                           eigenModelCount,partitionCount,preferenceFlags,requirementFlags,
                           &resourceNumber,&implName,&benchedFlags,&itBenchmarkResult,
                           *(int *)(plVar12 + 0x10) == 0);
        *(int *)(plVar12 + 0x38) = iVar6;
        *(int *)(plVar12 + 0x10) = resourceNumber;
        bVar14 = resourceNumber == 0;
        *(long *)(plVar12 + 0x48) = benchedFlags;
        *(char **)(plVar12 + 0x40) = implName;
        *(ulong *)(plVar12 + 0x50) =
             (ulong)bVar14 * (long)benchmarkResultCPU + (ulong)!bVar14 * (long)itBenchmarkResult;
        *(ulong *)(plVar12 + 0x58) =
             (ulong)bVar14 * 0x3ff0000000000000 +
             (ulong)!bVar14 * (long)(benchmarkResultCPU / itBenchmarkResult);
      }
      std::__cxx11::list<BeagleBenchmarkedResource,std::allocator<BeagleBenchmarkedResource>>::
      sort<bool(*)(BeagleBenchmarkedResource_const&,BeagleBenchmarkedResource_const&)>
                (this,compareBenchmarkResult);
      if (rsrcBenchList != (BeagleBenchmarkedResourceList *)0x0) {
        free(rsrcBenchList->list);
        free(rsrcBenchList);
      }
      pBVar8 = (BeagleBenchmarkedResourceList *)malloc(0x10);
      uVar3 = *(undefined8 *)(this + 0x10);
      rsrcBenchList = pBVar8;
      pBVar8->length = (int)uVar3;
      pBVar9 = (BeagleBenchmarkedResource *)malloc((long)(int)uVar3 * 0x50);
      plVar12 = *(list<BeagleBenchmarkedResource,std::allocator<BeagleBenchmarkedResource>> **)this;
      pBVar8->list = pBVar9;
      if (plVar12 != this) {
        lVar10 = 0;
        plVar11 = plVar12;
        do {
          *(undefined4 *)((long)&pBVar9->number + lVar10) = *(undefined4 *)(plVar11 + 0x10);
          *(long *)((long)&pBVar9->name + lVar10) = *(long *)(plVar11 + 0x18);
          *(long *)((long)&rsrcBenchList->list->description + lVar10) = *(long *)(plVar11 + 0x20);
          lVar4 = *(long *)(plVar11 + 0x30);
          pBVar9 = rsrcBenchList->list;
          plVar2 = (long *)((long)&pBVar9->supportFlags + lVar10);
          *plVar2 = *(long *)(plVar11 + 0x28);
          plVar2[1] = lVar4;
          *(undefined4 *)((long)&pBVar9->returnCode + lVar10) = *(undefined4 *)(plVar11 + 0x38);
          *(long *)((long)&pBVar9->implName + lVar10) = *(long *)(plVar11 + 0x40);
          pBVar9 = rsrcBenchList->list;
          *(long *)((long)&pBVar9->benchedFlags + lVar10) = *(long *)(plVar11 + 0x48);
          lVar4 = *(long *)(plVar11 + 0x58);
          plVar2 = (long *)((long)&pBVar9->benchmarkResult + lVar10);
          *plVar2 = *(long *)(plVar11 + 0x50);
          plVar2[1] = lVar4;
          lVar10 = lVar10 + 0x50;
          plVar11 = *(list<BeagleBenchmarkedResource,std::allocator<BeagleBenchmarkedResource>> **)
                     plVar11;
        } while (plVar11 != this);
        while (plVar12 != this) {
          plVar11 = *(list<BeagleBenchmarkedResource,std::allocator<BeagleBenchmarkedResource>> **)
                     plVar12;
          operator_delete(plVar12);
          plVar12 = plVar11;
        }
      }
      operator_delete(this);
      pBVar8 = rsrcBenchList;
    }
  }
  else {
    p_Var13 = possibleResources->_M_next;
    while (p_Var13 != possibleResources) {
      p_Var7 = (((_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                &p_Var13->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      operator_delete(p_Var13);
      p_Var13 = p_Var7;
    }
    operator_delete(possibleResources);
    pBVar8 = (BeagleBenchmarkedResourceList *)0x0;
  }
  return pBVar8;
}

Assistant:

BeagleBenchmarkedResourceList* beagleGetBenchmarkedResourceList(int tipCount,
                                                                int compactBufferCount,
                                                                int stateCount,
                                                                int patternCount,
                                                                int categoryCount,
                                                                int* resourceList,
                                                                int resourceCount,
                                                                long preferenceFlags,
                                                                long requirementFlags,
                                                                int eigenModelCount,
                                                                int partitionCount,
                                                                int calculateDerivatives,
                                                                long benchmarkFlags) {

#ifdef BEAGLE_DEBUG_FP_REDUCED_PRECISION
    debugPatternCount = patternCount;
#endif

    if (rsrcList == NULL)
        beagleGetResourceList();

    if (implFactory == NULL)
        beagleGetFactoryList();

    int errorCode = BEAGLE_SUCCESS;

    PairedList* possibleResources = new PairedList;

    errorCode = filterResources(resourceList,
                                resourceCount,
                                preferenceFlags,
                                requirementFlags,
                                possibleResources);

    if (errorCode != BEAGLE_SUCCESS) {
        delete possibleResources;
        return NULL;
    }

    RsrcBenchPairList *filteredRsrcBenchList = new RsrcBenchPairList;

    for(PairedList::iterator it = possibleResources->begin(); it != possibleResources->end(); ++it) {
        int resource = (*it).second;

        BeagleBenchmarkedResource itResource;
        itResource.number        = resource;
        itResource.name          = rsrcList->list[resource].name;
        itResource.description   = rsrcList->list[resource].description;
        itResource.supportFlags  = rsrcList->list[resource].supportFlags;
        itResource.requiredFlags = rsrcList->list[resource].requiredFlags;

        filteredRsrcBenchList->push_back(itResource);
    }

    delete possibleResources;

    bool manualScaling = (benchmarkFlags & BEAGLE_BENCHFLAG_SCALING_NONE ? false : true);
    int benchmarkReplicates = BENCHMARK_REPLICATES;
    int rescaleFrequency =
        (benchmarkFlags & BEAGLE_BENCHFLAG_SCALING_ALWAYS ? 1 : BENCHMARK_REPLICATES*2);

    int resourceNumber;
    char* implName;
    long benchedFlags;
    double benchmarkResultCPU;

    bool instOnly = false;

    errorCode = beagle::benchmark::benchmarkResource(0,
                                  stateCount,
                                  tipCount,
                                  patternCount,
                                  manualScaling,
                                  categoryCount,
                                  benchmarkReplicates,
                                  compactBufferCount,
                                  rescaleFrequency,
                                  (calculateDerivatives ? true : false),
                                  calculateDerivatives,
                                  eigenModelCount,
                                  partitionCount,
                                  preferenceFlags | requirementFlags,
                                  0,
                                  &resourceNumber,
                                  &implName,
                                  &benchedFlags,
                                  &benchmarkResultCPU,
                                  instOnly);

    if (errorCode != BEAGLE_SUCCESS) {
        return NULL;
    }

    for(RsrcBenchPairList::iterator it = filteredRsrcBenchList->begin();
        it != filteredRsrcBenchList->end(); ++it) {

        if ((*it).number == 0) {
            instOnly = true;
        } else {
            instOnly = false;
        }

        double itBenchmarkResult;

        (*it).returnCode = beagle::benchmark::benchmarkResource((*it).number,
                                                     stateCount,
                                                     tipCount,
                                                     patternCount,
                                                     manualScaling,
                                                     categoryCount,
                                                     benchmarkReplicates,
                                                     compactBufferCount,
                                                     rescaleFrequency,
                                                     (calculateDerivatives ? true : false),
                                                     calculateDerivatives,
                                                     eigenModelCount,
                                                     partitionCount,
                                                     preferenceFlags,
                                                     requirementFlags,
                                                     &resourceNumber,
                                                     &implName,
                                                     &benchedFlags,
                                                     &itBenchmarkResult,
                                                     instOnly);

        (*it).number         = resourceNumber;
        (*it).benchedFlags   = benchedFlags;
        (*it).implName       = implName;

        if ((*it).number == 0) {
            (*it).benchmarkResult = benchmarkResultCPU;
            (*it).performanceRatio = 1.0;
        } else {
            (*it).benchmarkResult = itBenchmarkResult;
            (*it).performanceRatio = benchmarkResultCPU / (*it).benchmarkResult;
        }
    }

    filteredRsrcBenchList->sort(compareBenchmarkResult); // order from fastest to slowest

   if (rsrcBenchList != NULL) {
        free(rsrcBenchList->list);
        free(rsrcBenchList);
    }

    rsrcBenchList = (BeagleBenchmarkedResourceList*) malloc(sizeof(BeagleBenchmarkedResourceList));
    rsrcBenchList->length = filteredRsrcBenchList->size();
    rsrcBenchList->list = (BeagleBenchmarkedResource*) malloc(sizeof(BeagleBenchmarkedResource) * rsrcBenchList->length);

    int i = 0;
    for(RsrcBenchPairList::iterator it = filteredRsrcBenchList->begin();
        it != filteredRsrcBenchList->end(); ++it) {
        rsrcBenchList->list[i].number           = (*it).number;
        rsrcBenchList->list[i].name             = (*it).name;
        rsrcBenchList->list[i].description      = (*it).description;
        rsrcBenchList->list[i].supportFlags     = (*it).supportFlags;
        rsrcBenchList->list[i].requiredFlags    = (*it).requiredFlags;
        rsrcBenchList->list[i].returnCode       = (*it).returnCode;
        rsrcBenchList->list[i].implName         = (*it).implName;
        rsrcBenchList->list[i].benchedFlags     = (*it).benchedFlags;
        rsrcBenchList->list[i].benchmarkResult  = (*it).benchmarkResult;
        rsrcBenchList->list[i].performanceRatio = (*it).performanceRatio;
        i++;
    }

    delete filteredRsrcBenchList;

    return rsrcBenchList;
}